

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocations.h
# Opt level: O2

void * ZSTD_customCalloc(size_t size,ZSTD_customMem customMem)

{
  void *pvVar1;
  
  if (customMem.customAlloc != (ZSTD_allocFunction)0x0) {
    pvVar1 = (*customMem.customAlloc)(customMem.opaque,size);
    pvVar1 = memset(pvVar1,0,size);
    return pvVar1;
  }
  pvVar1 = calloc(1,size);
  return pvVar1;
}

Assistant:

MEM_STATIC void* ZSTD_customCalloc(size_t size, ZSTD_customMem customMem)
{
    if (customMem.customAlloc) {
        /* calloc implemented as malloc+memset;
         * not as efficient as calloc, but next best guess for custom malloc */
        void* const ptr = customMem.customAlloc(customMem.opaque, size);
        ZSTD_memset(ptr, 0, size);
        return ptr;
    }
    return ZSTD_calloc(1, size);
}